

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gen.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
rc::Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator*
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  ValueType pGVar1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ValueType *ppGVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  _func_Any_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer *__ptr;
  _Head_base<0UL,_rc::detail::Any::IAnyImpl_*,_false> local_a8;
  undefined1 local_a0 [48];
  Gen<rc::detail::Any> local_70;
  Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_48;
  
  ppGVar6 = rc::detail::ImplicitParam<rc::gen::detail::param::CurrentHandler>::value();
  pGVar1 = *ppGVar6;
  Gen(&local_48,this);
  local_a0._0_8_ = rc::detail::Any::of<std::__cxx11::string>;
  rc::gen::map<std::__cxx11::string,rc::detail::Any(*)(std::__cxx11::string&&)>
            ((Gen<rc::detail::Any> *)(local_a0 + 8),(gen *)&local_48,
             (Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_a0,in_RCX);
  Gen<rc::detail::Any>::as(&local_70,(Gen<rc::detail::Any> *)(local_a0 + 8),&this->m_name);
  (**pGVar1->_vptr_GenerationHandler)(&local_a8,pGVar1,&local_70);
  pbVar7 = rc::detail::Any::get<std::__cxx11::string>((Any *)&local_a8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pbVar7->_M_dataplus)._M_p;
  paVar8 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar8) {
    uVar3 = *(undefined4 *)((long)&pbVar7->field_2 + 4);
    uVar4 = *(undefined4 *)((long)&pbVar7->field_2 + 8);
    uVar5 = *(undefined4 *)((long)&pbVar7->field_2 + 0xc);
    *(undefined4 *)&__return_storage_ptr__->field_2 = *(undefined4 *)paVar8;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 4) = uVar3;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 0xc) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  if (local_a8._M_head_impl != (IAnyImpl *)0x0) {
    (*(local_a8._M_head_impl)->_vptr_IAnyImpl[5])();
  }
  local_a8._M_head_impl = (IAnyImpl *)0x0;
  Gen<rc::detail::Any>::~Gen(&local_70);
  Gen<rc::detail::Any>::~Gen((Gen<rc::detail::Any> *)(local_a0 + 8));
  ~Gen(&local_48);
  return __return_storage_ptr__;
}

Assistant:

T Gen<T>::operator*() const {
  using namespace detail;
  using rc::gen::detail::param::CurrentHandler;
  const auto handler = ImplicitParam<CurrentHandler>::value();
  return std::move(handler->onGenerate(gen::map(*this, &Any::of<T>).as(m_name))
                       .template get<T>());
}